

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *
getSlicingCriteriaValues
          (Module *M,string *slicingCriteria,string *legacySlicingCriteria,
          string *legacySecondaryCriteria,bool criteria_are_next_instr)

{
  bool bVar1;
  size_type sVar2;
  const_iterator __position;
  iterator __last;
  iterator this;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte in_R9B;
  LLVMPointerAnalysis *unaff_retaddr;
  bool in_stack_0000000f;
  string *in_stack_00000010;
  Module *in_stack_00000018;
  SlicingCriteriaSet *critset;
  iterator __end1;
  iterator __begin1;
  vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *__range1;
  vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> C;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *legacyCriterion;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  legacyCriteriaParts;
  string criteria;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  iterator in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  _Rb_tree_const_iterator<const_llvm::Value_*> in_stack_fffffffffffffe70;
  __normal_iterator<SlicingCriteriaSet_*,_std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>_>
  local_178;
  undefined1 *local_170;
  undefined1 local_168 [31];
  byte local_149;
  string local_148 [32];
  string local_128 [36];
  int local_104;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  reference local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  undefined1 *local_70;
  undefined1 local_68 [24];
  string local_50 [39];
  byte local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined1 constructed_only;
  
  local_29 = in_R9B & 1;
  __lhs = in_RDI;
  pbVar3 = in_RDI;
  std::__cxx11::string::string(local_50,in_RDX);
  bVar1 = std::operator!=(__lhs,(char *)in_RDI);
  constructed_only = (undefined1)((ulong)pbVar3 >> 0x38);
  if (bVar1) {
    splitList(in_stack_fffffffffffffe58,(char)((ulong)in_stack_fffffffffffffe50 >> 0x38));
    local_70 = local_68;
    local_78._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_RDI);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_RDI);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)__lhs,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_RDI);
      constructed_only = (undefined1)((ulong)pbVar3 >> 0x38);
      if (!bVar1) break;
      local_88 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_78);
      bVar1 = std::operator!=(__lhs,(char *)in_RDI);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_50,";");
      }
      splitList(in_stack_fffffffffffffe58,(char)((ulong)in_stack_fffffffffffffe50 >> 0x38));
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_a0);
      if (sVar2 == 2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_a0,0);
        std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30._M_node);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_a0,1);
        std::operator+(in_stack_fffffffffffffe28,__lhs);
        std::__cxx11::string::operator+=(local_50,local_c0);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::~string(local_e0);
LAB_001df9c6:
        bVar1 = std::operator!=(__lhs,(char *)in_RDI);
        if (bVar1) {
          std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
          std::operator+(in_stack_fffffffffffffe28,(char *)__lhs);
          std::__cxx11::string::operator+=(local_50,local_128);
          std::__cxx11::string::~string(local_128);
          std::__cxx11::string::~string(local_148);
        }
        local_104 = 0;
      }
      else {
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_a0);
        if (sVar2 == 1) {
          std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30._M_node);
          std::__cxx11::string::operator+=(local_50,local_100);
          std::__cxx11::string::~string(local_100);
          goto LAB_001df9c6;
        }
        llvm::errs();
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_fffffffffffffe30._M_node,
                   (char *)in_stack_fffffffffffffe28);
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_fffffffffffffe30._M_node,in_stack_fffffffffffffe28);
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_fffffffffffffe30._M_node,
                   (char *)in_stack_fffffffffffffe28);
        memset(in_RDI,0,0x18);
        std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::vector
                  ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)0x1df9b4);
        local_104 = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe30._M_node);
      constructed_only = (undefined1)((ulong)pbVar3 >> 0x38);
      if (local_104 != 0) goto LAB_001dfa8b;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_78);
    }
    local_104 = 0;
LAB_001dfa8b:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe30._M_node);
    if (local_104 != 0) goto LAB_001dfc3b;
  }
  local_149 = 0;
  std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::vector
            ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)0x1dfabc);
  getSlicingCriteriaInstructions
            (in_stack_00000018,in_stack_00000010,in_stack_0000000f,unaff_retaddr,
             (bool)constructed_only);
  local_170 = local_168;
  local_178._M_current =
       (SlicingCriteriaSet *)
       std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::begin
                 ((vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *)in_RDI);
  std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::end
            ((vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<SlicingCriteriaSet_*,_std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>_>
                             *)__lhs,(__normal_iterator<SlicingCriteriaSet_*,_std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>_>
                                      *)in_RDI), bVar1) {
    __position._M_current =
         (Value **)
         __gnu_cxx::
         __normal_iterator<SlicingCriteriaSet_*,_std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>_>
         ::operator*(&local_178);
    __last = std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::end
                       ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)in_RDI)
    ;
    __gnu_cxx::
    __normal_iterator<llvm::Value_const*const*,std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>
    ::__normal_iterator<llvm::Value_const**>
              ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                *)__lhs,(__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                         *)in_RDI);
    this = std::
           set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
           ::begin((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                    *)in_RDI);
    std::
    set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>::
    end((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
         *)in_RDI);
    std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
    insert<std::_Rb_tree_const_iterator<llvm::Value_const*>,void>
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)this._M_node,
               __position,in_stack_fffffffffffffe70,
               (_Rb_tree_const_iterator<const_llvm::Value_*>)__last._M_current);
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::end
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)in_RDI);
    __gnu_cxx::
    __normal_iterator<llvm::Value_const*const*,std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>
    ::__normal_iterator<llvm::Value_const**>
              ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                *)__lhs,(__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                         *)in_RDI);
    std::
    set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>::
    begin((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
           *)in_RDI);
    in_stack_fffffffffffffe30 =
         std::
         set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
         ::end((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                *)in_RDI);
    std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
    insert<std::_Rb_tree_const_iterator<llvm::Value_const*>,void>
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)this._M_node,
               __position,in_stack_fffffffffffffe70,
               (_Rb_tree_const_iterator<const_llvm::Value_*>)__last._M_current);
    __gnu_cxx::
    __normal_iterator<SlicingCriteriaSet_*,_std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>_>
    ::operator++(&local_178);
  }
  local_149 = 1;
  local_104 = 1;
  std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::~vector
            ((vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *)
             in_stack_fffffffffffffe30._M_node);
  if ((local_149 & 1) == 0) {
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~vector
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
               in_stack_fffffffffffffe30._M_node);
  }
LAB_001dfc3b:
  std::__cxx11::string::~string(local_50);
  return (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)__lhs;
}

Assistant:

std::vector<const llvm::Value *>
getSlicingCriteriaValues(llvm::Module &M, const std::string &slicingCriteria,
                         const std::string &legacySlicingCriteria,
                         const std::string &legacySecondaryCriteria,
                         bool criteria_are_next_instr) {
    std::string criteria = slicingCriteria;
    if (legacySlicingCriteria != "") {
        auto legacyCriteriaParts = splitList(legacySlicingCriteria, ',');
        for (auto &legacyCriterion : legacyCriteriaParts) {
            if (criteria != "")
                criteria += ";";

            auto parts = splitList(legacyCriterion, ':');
            if (parts.size() == 2) {
                criteria += parts[0] + "#" + parts[1];
            } else if (parts.size() == 1) {
                criteria += legacyCriterion + "()";
            } else {
                llvm::errs()
                        << "Unsupported criteria: " << legacyCriterion << "\n";
                return {};
            }
            if (legacySecondaryCriteria != "") {
                criteria += "|" + legacySecondaryCriteria + "()";
            }
        }
    }

    std::vector<const llvm::Value *> ret;
    auto C = getSlicingCriteriaInstructions(
            M, criteria, criteria_are_next_instr,
            /*pta = */ nullptr, /* constructed only */ false);
    for (auto &critset : C) {
        ret.insert(ret.end(), critset.primary.begin(), critset.primary.end());
        ret.insert(ret.end(), critset.secondary.begin(),
                   critset.secondary.end());
    }
    return ret;
}